

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncapsulatedFileManager.cpp
# Opt level: O0

void __thiscall
supermap::io::EncapsulatedFileManager::swap(EncapsulatedFileManager *this,path *a,path *b)

{
  pointer pFVar1;
  path *in_RDI;
  path *in_stack_00000020;
  EncapsulatedFileManager *in_stack_00000028;
  undefined1 local_68 [40];
  undefined1 local_40 [64];
  
  pFVar1 = std::
           unique_ptr<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>::
           operator->((unique_ptr<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>
                       *)0x11a20f);
  makeRootPath(in_stack_00000028,in_stack_00000020);
  makeRootPath(in_stack_00000028,in_stack_00000020);
  (*pFVar1->_vptr_FileManager[4])(pFVar1,local_40,local_68);
  std::filesystem::__cxx11::path::~path(in_RDI);
  std::filesystem::__cxx11::path::~path(in_RDI);
  return;
}

Assistant:

void EncapsulatedFileManager::swap(const std::filesystem::path &a, const std::filesystem::path &b) {
    innerManager_->swap(makeRootPath(a), makeRootPath(b));
}